

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O1

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_1)

{
  pointer pcVar1;
  uint_least32_t uVar2;
  
  this->region_size_ = param_1->region_size_;
  uVar2 = param_1->column_num_;
  this->line_num_ = param_1->line_num_;
  this->column_num_ = uVar2;
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  pcVar1 = (param_1->file_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_name_,pcVar1,pcVar1 + (param_1->file_name_)._M_string_length);
  (this->line_str_)._M_dataplus._M_p = (pointer)&(this->line_str_).field_2;
  pcVar1 = (param_1->line_str_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->line_str_,pcVar1,pcVar1 + (param_1->line_str_)._M_string_length);
  return;
}

Assistant:

source_location(source_location const&) = default;